

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_number.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::Boxed_Number::go<double,long_double>
          (Boxed_Number *this,Opers t_oper,Boxed_Value *t_bv,double *t_lhs,double *c_lhs,
          longdouble *c_rhs)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  bool b;
  longdouble lVar3;
  longdouble lVar4;
  Boxed_Value BVar5;
  longdouble local_18;
  
  switch(t_oper) {
  case equals:
    b = (longdouble)*c_lhs == *c_rhs;
    break;
  case less_than:
    lVar4 = (longdouble)*c_lhs;
    lVar3 = *c_rhs;
    goto LAB_00323571;
  case greater_than:
    lVar3 = (longdouble)*c_lhs;
    lVar4 = *c_rhs;
LAB_00323571:
    b = lVar4 < lVar3;
    break;
  case less_than_equal:
    lVar4 = (longdouble)*c_lhs;
    lVar3 = *c_rhs;
    goto LAB_00323557;
  case greater_than_equal:
    lVar3 = (longdouble)*c_lhs;
    lVar4 = *c_rhs;
LAB_00323557:
    b = lVar4 <= lVar3;
    break;
  case not_equal:
    b = (longdouble)*c_lhs != *c_rhs;
    break;
  default:
    switch(t_oper) {
    case sum:
      local_18 = *c_rhs + (longdouble)*c_lhs;
      break;
    case quotient:
      local_18 = (longdouble)*c_lhs / *c_rhs;
      break;
    case product:
      local_18 = *c_rhs * (longdouble)*c_lhs;
      break;
    case difference:
      local_18 = (longdouble)*c_lhs - *c_rhs;
      break;
    default:
      if (t_lhs == (double *)0x0) {
switchD_00323531_caseD_7:
        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar2 = &PTR__bad_cast_003f7e20;
        __cxa_throw(puVar2,&detail::exception::bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      switch(t_oper) {
      case assign:
        lVar4 = *c_rhs;
        break;
      default:
        goto switchD_00323531_caseD_7;
      case assign_product:
        lVar4 = *c_rhs * (longdouble)*t_lhs;
        break;
      case assign_sum:
        lVar4 = *c_rhs + (longdouble)*t_lhs;
        break;
      case assign_quotient:
        lVar4 = (longdouble)*t_lhs / *c_rhs;
        break;
      case assign_difference:
        lVar4 = (longdouble)*t_lhs - *c_rhs;
      }
      *t_lhs = (double)lVar4;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (t_bv->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var1 = (t_bv->m_data).
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->bv).m_data.
      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = p_Var1;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
        }
      }
      goto LAB_003235b0;
    }
    BVar5 = detail::const_var_impl<long_double>((detail *)this,&local_18);
    t_bv = BVar5.m_data.
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi;
    goto LAB_003235b0;
  }
  BVar5 = const_var((chaiscript *)this,b);
  t_bv = BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
LAB_003235b0:
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_bv;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto go(Operators::Opers t_oper, const Boxed_Value &t_bv, LHS *t_lhs, const LHS &c_lhs, const RHS &c_rhs) {
      switch (t_oper) {
        case Operators::Opers::equals:
          return const_var(c_lhs == c_rhs);
        case Operators::Opers::less_than:
          return const_var(c_lhs < c_rhs);
        case Operators::Opers::greater_than:
          return const_var(c_lhs > c_rhs);
        case Operators::Opers::less_than_equal:
          return const_var(c_lhs <= c_rhs);
        case Operators::Opers::greater_than_equal:
          return const_var(c_lhs >= c_rhs);
        case Operators::Opers::not_equal:
          return const_var(c_lhs != c_rhs);
        case Operators::Opers::sum:
          return const_var(c_lhs + c_rhs);
        case Operators::Opers::quotient:
          check_divide_by_zero(c_rhs);
          return const_var(c_lhs / c_rhs);
        case Operators::Opers::product:
          return const_var(c_lhs * c_rhs);
        case Operators::Opers::difference:
          return const_var(c_lhs - c_rhs);
        default:
          break;
      }

      if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
        switch (t_oper) {
          case Operators::Opers::shift_left:
            return const_var(c_lhs << c_rhs);
          case Operators::Opers::shift_right:
            return const_var(c_lhs >> c_rhs);
          case Operators::Opers::remainder:
            check_divide_by_zero(c_rhs);
            return const_var(c_lhs % c_rhs);
          case Operators::Opers::bitwise_and:
            return const_var(c_lhs & c_rhs);
          case Operators::Opers::bitwise_or:
            return const_var(c_lhs | c_rhs);
          case Operators::Opers::bitwise_xor:
            return const_var(c_lhs ^ c_rhs);
          default:
            break;
        }
      }

      if (t_lhs) {
        switch (t_oper) {
          case Operators::Opers::assign:
            *t_lhs = c_rhs;
            return t_bv;
          case Operators::Opers::assign_product:
            *t_lhs *= c_rhs;
            return t_bv;
          case Operators::Opers::assign_sum:
            *t_lhs += c_rhs;
            return t_bv;
          case Operators::Opers::assign_quotient:
            check_divide_by_zero(c_rhs);
            *t_lhs /= c_rhs;
            return t_bv;
          case Operators::Opers::assign_difference:
            *t_lhs -= c_rhs;
            return t_bv;
          default:
            break;
        }

        if constexpr (!std::is_floating_point<LHS>::value && !std::is_floating_point<RHS>::value) {
          switch (t_oper) {
            case Operators::Opers::assign_bitwise_and:
              check_divide_by_zero(c_rhs);
              *t_lhs &= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_or:
              *t_lhs |= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_left:
              *t_lhs <<= c_rhs;
              return t_bv;
            case Operators::Opers::assign_shift_right:
              *t_lhs >>= c_rhs;
              return t_bv;
            case Operators::Opers::assign_remainder:
              *t_lhs %= c_rhs;
              return t_bv;
            case Operators::Opers::assign_bitwise_xor:
              *t_lhs ^= c_rhs;
              return t_bv;
            default:
              break;
          }
        }
      }

      throw chaiscript::detail::exception::bad_any_cast();
    }